

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  basic_fp<unsigned___int128> value_00;
  uint64_t divisor;
  uint uVar4;
  result rVar5;
  int iVar6;
  long lVar7;
  decimal_fp<float> dVar8;
  format_error *this;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  uint64_t error;
  char cVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  buffer<char> *pbVar21;
  float fVar22;
  decimal_fp<double> dVar23;
  gen_digits_handler handler;
  int local_c4;
  ulong local_c0;
  gen_digits_handler local_b8;
  buffer<char> *local_a0;
  int local_94;
  double local_90;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xc1e,"value is negative");
  }
  uVar12 = (ulong)(uint)precision;
  local_c0 = (ulong)specs & 0xff00000000;
  local_b8.fixed = local_c0 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && local_c0 == 0x200000000) {
      uVar20 = buf->capacity_;
      if (uVar20 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar20 = buf->capacity_;
      }
      if (uVar12 <= uVar20) {
        uVar20 = uVar12;
      }
      buf->size_ = uVar20;
      memset(buf->ptr_,0x30,uVar12);
      return -precision;
    }
    sVar19 = buf->size_;
    uVar12 = sVar19 + 1;
    if (buf->capacity_ < uVar12) {
      (**buf->_vptr_buffer)(buf);
      sVar19 = buf->size_;
      uVar12 = sVar19 + 1;
    }
    buf->size_ = uVar12;
    buf->ptr_[sVar19] = '0';
    return 0;
  }
  local_88 = (ulong)specs >> 0x20;
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar23 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar23.significand);
      return dVar23.exponent;
    }
    dVar8 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar8.significand);
    return dVar8.exponent;
  }
  local_70 = (ulong)value & 0xfffffffffffff;
  iVar16 = (uint)((ulong)value >> 0x34) - 0x433;
  local_68 = (ulong)value & 0x7ff0000000000000;
  local_94 = -0x432;
  if (local_68 == 0) {
    lVar1 = 0x3f;
    if (local_70 != 0) {
      for (; local_70 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    lVar7 = local_70 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar16 = ((uint)lVar1 ^ 0xffffffc0) - 0x426;
  }
  else {
    lVar7 = local_70 + 0x10000000000000;
    local_94 = iVar16;
  }
  iVar6 = (int)((ulong)((long)(-0x32 - iVar16) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar10 = iVar6 + 0x15b;
  uVar4 = iVar6 + 0x162;
  if (-1 < (int)uVar10) {
    uVar4 = uVar10;
  }
  local_60 = (ulong)(uVar4 & 0xfffffff8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = lVar7 << 0xb;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = basic_data<void>::pow10_significands[(long)((int)uVar4 >> 3) + 1];
  uVar20 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  bVar9 = -((char)basic_data<void>::pow10_exponents[(long)((int)uVar4 >> 3) + 1] + (char)iVar16) -
          0x35;
  local_b8.buf = buf->ptr_;
  local_b8.size = 0;
  local_b8.exp10 = 0x154 - (uVar4 & 0xfffffff8);
  local_80 = 1L << (bVar9 & 0x3f);
  uVar12 = uVar20 >> (bVar9 & 0x3f);
  local_b8.precision = precision;
  if ((uint)uVar12 == 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa40,"");
  }
  local_a0 = buf;
  if (uVar12 >> 0x20 != 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xa41,"");
  }
  uVar10 = (uint)uVar12 | 1;
  uVar4 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar11 = uVar12 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar4 * 8);
  uVar18 = uVar11 >> 0x20;
  iVar16 = (int)(uVar11 >> 0x20);
  if (local_c0 == 0x200000000) {
    uVar4 = local_b8.exp10 + iVar16;
    if ((uVar4 ^ 0x7fffffff) < (uint)precision && 0 < (int)uVar4) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_b8.precision = uVar4 + precision;
    if (local_b8.precision != 0 && SCARRY4(uVar4,precision) == local_b8.precision < 0)
    goto LAB_00140c4d;
    if (local_b8.precision < 0) {
      local_c4 = iVar16 + local_b8.exp10;
      uVar12 = 0;
      goto LAB_00141038;
    }
    uVar11 = basic_data<void>::power_of_10_64[(long)(uVar11 - 0x100000000) >> 0x20] <<
             (bVar9 & 0x3f);
    uVar12 = uVar20 / 10;
    if (uVar11 <= uVar12) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                  ,0x9ed,"");
    }
    if (uVar11 < 0xb) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                  ,0x9ee,"");
    }
    if (0xfffffffffffffff4 < uVar11 - 0x15) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                  ,0x9ef,"");
    }
    if (((uVar12 <= uVar11 - uVar12) && (cVar14 = '0', 0x13 < uVar11 + uVar12 * -2)) ||
       ((iVar6 = 0, 99 < uVar20 && (cVar14 = '1', uVar11 - (uVar12 - 10) <= uVar12 - 10)))) {
      local_b8.size = 1;
      *local_b8.buf = cVar14;
      goto LAB_00141026;
    }
  }
  else {
LAB_00140c4d:
    local_78 = local_80 - 1;
    uVar20 = uVar20 & local_78;
    puVar13 = basic_data<void>::power_of_10_64 + (iVar16 - 1);
    local_90 = value;
    do {
      uVar4 = (uint)uVar18;
      switch(uVar4 - 1) {
      case 0:
        cVar14 = (char)uVar12;
        uVar12 = 0;
        goto LAB_00140d62;
      case 1:
        cVar14 = (char)((uVar12 & 0xffffffff) / 10);
        iVar16 = (int)((uVar12 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar14 = (char)((uVar12 & 0xffffffff) / 100);
        iVar16 = (int)((uVar12 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar14 = (char)((uVar12 & 0xffffffff) / 1000);
        iVar16 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar14 = (char)((uVar12 & 0xffffffff) / 10000);
        iVar16 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar11 = uVar12 >> 5 & 0x7ffffff;
        cVar14 = (char)(uVar11 / 0xc35);
        iVar16 = (int)(uVar11 / 0xc35) * 100000;
        break;
      case 6:
        cVar14 = (char)((uVar12 & 0xffffffff) / 1000000);
        iVar16 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar14 = (char)((uVar12 & 0xffffffff) / 10000000);
        iVar16 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar14 = (char)((uVar12 & 0xffffffff) / 100000000);
        iVar16 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar11 = (uVar12 >> 9 & 0x7fffff) * 0x44b83;
        cVar14 = (char)(uVar11 >> 0x27);
        iVar16 = (uint)(uVar11 >> 0x27) * 1000000000;
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                    ,0xa7e,"invalid number of digits");
      }
      uVar12 = (ulong)(uint)((int)uVar12 - iVar16);
LAB_00140d62:
      rVar5 = gen_digits_handler::on_digit
                        (&local_b8,cVar14 + '0',*puVar13 << (bVar9 & 0x3f),
                         (uVar12 << (bVar9 & 0x3f)) + uVar20,1,true);
      divisor = local_80;
      if (rVar5 != more) {
        iVar16 = uVar4 - 1;
        goto LAB_00140e09;
      }
      puVar13 = puVar13 + -1;
      uVar18 = (ulong)(uVar4 - 1);
    } while (1 < uVar4);
    error = 1;
    iVar16 = 0;
    do {
      uVar12 = uVar20 * 10;
      error = error * 10;
      uVar20 = uVar12 & local_78;
      iVar16 = iVar16 + -1;
      rVar5 = gen_digits_handler::on_digit
                        (&local_b8,(char)(uVar12 >> (bVar9 & 0x3f)) + '0',divisor,uVar20,error,false
                        );
    } while (rVar5 == more);
LAB_00140e09:
    value = local_90;
    iVar6 = local_b8.precision;
    if (rVar5 != error) {
LAB_00141026:
      uVar12 = (ulong)(uint)local_b8.size;
      local_c4 = iVar16 + local_b8.exp10;
      if (local_b8.size < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                    ,0x199,"negative value");
      }
LAB_00141038:
      pbVar21 = local_a0;
      uVar11 = local_c0;
      uVar20 = local_a0->capacity_;
      uVar4 = (uint)local_88;
      if (uVar20 < uVar12) {
        (**local_a0->_vptr_buffer)(local_a0,uVar12);
        uVar20 = pbVar21->capacity_;
      }
      if (uVar20 < uVar12) {
        uVar12 = uVar20;
      }
      pbVar21->size_ = uVar12;
      goto LAB_00141076;
    }
  }
  pbVar21 = local_a0;
  uVar11 = local_c0;
  local_c4 = (local_b8.size - ((int)local_60 + 8)) + iVar16 + 0x15b;
  uVar4 = (uint)local_88;
  if ((uVar4 >> 0x12 & 1) == 0) {
    local_58 = local_70 | 0x10000000000000;
    if (local_68 == 0) {
      local_58 = local_70;
    }
    bVar15 = local_68 >> 0x35 != 0 && local_70 == 0;
    local_48 = local_94;
  }
  else {
    fVar22 = (float)value;
    uVar10 = (uint)fVar22 & 0x7fffff;
    uVar17 = (uint)fVar22 & 0x7f800000;
    local_58 = (ulong)uVar10 + 0x800000;
    if (uVar17 == 0) {
      local_58 = (ulong)uVar10;
    }
    local_48 = -0x95;
    if (uVar17 != 0) {
      local_48 = ((uint)fVar22 >> 0x17) - 0x96;
    }
    bVar15 = 0xffffff < uVar17 && uVar10 == 0;
  }
  uVar10 = bVar15 + 4;
  if (local_c0 != 0x200000000) {
    uVar10 = (uint)bVar15;
  }
  iVar16 = 0x2ff;
  if (iVar6 < 0x2ff) {
    iVar16 = iVar6;
  }
  uStack_50 = 0;
  value_00._20_4_ = uStack_44;
  value_00.e = local_48;
  value_00.f._8_8_ = 0;
  value_00.f._0_8_ = local_58;
  value_00._24_8_ = uStack_40;
  format_dragon(value_00,uVar10,iVar16,local_a0,&local_c4);
LAB_00141076:
  if ((uVar4 >> 0x13 & 1) == 0 && uVar11 != 0x200000000) {
    sVar19 = pbVar21->size_;
    if (sVar19 != 0) {
      do {
        iVar16 = local_c4 + 1;
        if (pbVar21->ptr_[sVar19 - 1] != '0') {
          uVar12 = pbVar21->capacity_;
          if (uVar12 < sVar19) {
            (**pbVar21->_vptr_buffer)(pbVar21,sVar19);
            uVar12 = pbVar21->capacity_;
          }
          goto LAB_001410b9;
        }
        sVar19 = sVar19 - 1;
        local_c4 = iVar16;
      } while (sVar19 != 0);
    }
    uVar12 = pbVar21->capacity_;
    sVar19 = 0;
LAB_001410b9:
    if (uVar12 < sVar19) {
      sVar19 = uVar12;
    }
    pbVar21->size_ = sVar19;
  }
  return local_c4;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}